

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmodsound.cpp
# Opt level: O2

bool IsFModExPresent(void)

{
  return false;
}

Assistant:

bool IsFModExPresent()
{
#ifdef NO_FMOD
	return false;
#elif !defined _MSC_VER
	return true;	// on non-MSVC we cannot delay load the library so it has to be present.
#else
	static bool cached_result;
	static bool done = false;

	if (!done)
	{
		done = true;

		FMOD::System *Sys;
		FMOD_RESULT result;
		__try
		{
			result = FMOD::System_Create(&Sys);
		}
		__except (CheckException(GetExceptionCode()))
		{
			// FMod could not be delay loaded
			return false;
		}
		if (result == FMOD_OK) Sys->release();
		cached_result = true;
	}
	return cached_result;
#endif
}